

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_strategy.h
# Opt level: O2

int32_t __thiscall charls::decoder_strategy::read_value(decoder_strategy *this,int32_t length)

{
  ulong uVar1;
  uint __line;
  int iVar2;
  char *__assertion;
  
  iVar2 = this->valid_bits_;
  if (iVar2 < length) {
    fill_read_cache(this);
    iVar2 = this->valid_bits_;
    if (iVar2 < length) {
      impl::throw_jpegls_error(InvalidCompressedData);
    }
  }
  if ((length == 0) || (iVar2 < length)) {
    __assertion = "length != 0 && length <= valid_bits_";
    __line = 0x6e;
  }
  else {
    if (length < 0x20) {
      uVar1 = this->read_cache_;
      skip(this,length);
      return (int32_t)(uVar1 >> (-(char)length & 0x3fU));
    }
    __assertion = "length < 32";
    __line = 0x6f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/decoder_strategy.h"
                ,__line,"int32_t charls::decoder_strategy::read_value(const int32_t)");
}

Assistant:

FORCE_INLINE int32_t read_value(const int32_t length)
    {
        if (valid_bits_ < length)
        {
            fill_read_cache();
            if (UNLIKELY(valid_bits_ < length))
                impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);
        }

        ASSERT(length != 0 && length <= valid_bits_);
        ASSERT(length < 32);
        const auto result{static_cast<int32_t>(read_cache_ >> (cache_t_bit_count - length))};
        skip(length);
        return result;
    }